

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O2

factor * __thiscall merlin::factor::normalize(factor *this)

{
  value vVar1;
  
  vVar1 = sum(this);
  if ((vVar1 != 0.0) || (NAN(vVar1))) {
    binaryOpIP<merlin::factor::binOpDivide>(this);
  }
  return this;
}

Assistant:

factor& normalize() {
		double Z = sum();
		if (Z != 0)
			*this /= Z;
		return *this;
	}